

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

void tcu::clear(PixelBufferAccess *access,IVec4 *color)

{
  uint uVar1;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  int x;
  anon_union_8_2_c961180f pixel;
  PixelBufferAccess local_50;
  
  uVar3 = TextureFormat::getPixelSize((TextureFormat *)access);
  if (((uVar3 == (access->super_ConstPixelBufferAccess).m_pitch.m_data[0]) && ((int)uVar3 < 8)) &&
     (0x7f < (access->super_ConstPixelBufferAccess).m_size.m_data[1] *
             (access->super_ConstPixelBufferAccess).m_size.m_data[0] *
             (access->super_ConstPixelBufferAccess).m_size.m_data[2])) {
    iVar10 = 0;
    PixelBufferAccess::PixelBufferAccess(&local_50,(TextureFormat *)access,1,1,1,0,0,&pixel);
    PixelBufferAccess::setPixel(&local_50,color,0,0,0);
    if (0 < (access->super_ConstPixelBufferAccess).m_size.m_data[2]) {
      do {
        if (0 < (access->super_ConstPixelBufferAccess).m_size.m_data[1]) {
          iVar4 = 0;
          do {
            pvVar2 = (access->super_ConstPixelBufferAccess).m_data;
            uVar1 = (access->super_ConstPixelBufferAccess).m_size.m_data[0];
            lVar7 = (long)((access->super_ConstPixelBufferAccess).m_pitch.m_data[1] * iVar4);
            lVar8 = (long)((access->super_ConstPixelBufferAccess).m_pitch.m_data[2] * iVar10);
            uVar5 = (long)pvVar2 + lVar8 + lVar7;
            if (uVar3 == 4) {
              if ((uVar5 & 3) != 0) goto LAB_019ec67f;
              if (0 < (int)uVar1) {
                uVar5 = 0;
                do {
                  *(undefined4 *)((long)pvVar2 + uVar5 * 4 + lVar8 + lVar7) = pixel.u64._0_4_;
                  uVar5 = uVar5 + 1;
                } while (uVar1 != uVar5);
              }
            }
            else if ((uVar3 == 8) && ((uVar5 & 7) == 0)) {
              if (0 < (int)uVar1) {
                uVar5 = 0;
                do {
                  *(ulong *)((long)pvVar2 + uVar5 * 8 + lVar8 + lVar7) =
                       CONCAT44(pixel.u64._4_4_,pixel.u64._0_4_);
                  uVar5 = uVar5 + 1;
                } while (uVar1 != uVar5);
              }
            }
            else {
LAB_019ec67f:
              if (0 < (int)uVar1) {
                lVar7 = 0;
                uVar6 = 0;
                do {
                  if (0 < (int)uVar3) {
                    uVar9 = 0;
                    do {
                      *(undefined1 *)(uVar5 + (long)((int)lVar7 + (int)uVar9)) =
                           *(undefined1 *)
                            ((long)local_50.super_ConstPixelBufferAccess.m_size.m_data +
                            (uVar9 - 0x10));
                      uVar9 = uVar9 + 1;
                    } while (uVar3 != uVar9);
                  }
                  uVar6 = uVar6 + 1;
                  lVar7 = lVar7 + (ulong)uVar3;
                } while (uVar6 != uVar1);
              }
            }
            iVar4 = iVar4 + 1;
          } while (iVar4 < (access->super_ConstPixelBufferAccess).m_size.m_data[1]);
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < (access->super_ConstPixelBufferAccess).m_size.m_data[2]);
    }
  }
  else if (0 < (access->super_ConstPixelBufferAccess).m_size.m_data[2]) {
    iVar10 = 0;
    do {
      if (0 < (access->super_ConstPixelBufferAccess).m_size.m_data[1]) {
        iVar4 = 0;
        do {
          if (0 < (access->super_ConstPixelBufferAccess).m_size.m_data[0]) {
            x = 0;
            do {
              PixelBufferAccess::setPixel(access,color,x,iVar4,iVar10);
              x = x + 1;
            } while (x < (access->super_ConstPixelBufferAccess).m_size.m_data[0]);
          }
          iVar4 = iVar4 + 1;
        } while (iVar4 < (access->super_ConstPixelBufferAccess).m_size.m_data[1]);
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < (access->super_ConstPixelBufferAccess).m_size.m_data[2]);
  }
  return;
}

Assistant:

void clear (const PixelBufferAccess& access, const IVec4& color)
{
	const int	pixelSize				= access.getFormat().getPixelSize();
	const int	pixelPitch				= access.getPixelPitch();
	const bool	rowPixelsTightlyPacked	= (pixelSize == pixelPitch);

	if (access.getWidth()*access.getHeight()*access.getDepth() >= CLEAR_OPTIMIZE_THRESHOLD &&
		pixelSize < CLEAR_OPTIMIZE_MAX_PIXEL_SIZE && rowPixelsTightlyPacked)
	{
		// Convert to destination format.
		union
		{
			deUint8		u8[CLEAR_OPTIMIZE_MAX_PIXEL_SIZE];
			deUint64	u64; // Forces 64-bit alignment.
		} pixel;
		DE_STATIC_ASSERT(sizeof(pixel) == CLEAR_OPTIMIZE_MAX_PIXEL_SIZE);
		PixelBufferAccess(access.getFormat(), 1, 1, 1, 0, 0, &pixel.u8[0]).setPixel(color, 0, 0);

		for (int z = 0; z < access.getDepth(); z++)
			for (int y = 0; y < access.getHeight(); y++)
				fillRow(access, y, z, pixelSize, &pixel.u8[0]);
	}
	else
	{
		for (int z = 0; z < access.getDepth(); z++)
			for (int y = 0; y < access.getHeight(); y++)
				for (int x = 0; x < access.getWidth(); x++)
					access.setPixel(color, x, y, z);
	}
}